

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void xmlHashScanFull3(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,
                     xmlHashScannerFull scan,void *data)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  int iVar6;
  uint uVar7;
  xmlHashEntry *pxVar8;
  
  if ((hash != (xmlHashTablePtr)0x0) &&
     (uVar1 = hash->size, scan != (xmlHashScannerFull)0x0 && (ulong)uVar1 != 0)) {
    pxVar2 = hash->table;
    uVar7 = pxVar2->hashValue;
    pxVar8 = pxVar2;
    while (uVar7 != 0) {
      pxVar8 = pxVar8 + 1;
      if (pxVar2 + uVar1 <= pxVar8) {
        pxVar8 = pxVar2;
      }
      uVar7 = pxVar8->hashValue;
    }
    if (hash->size != 0) {
      uVar7 = 0;
      do {
        if ((pxVar8->hashValue != 0) && (pxVar8->payload != (void *)0x0)) {
          while ((((key == (xmlChar *)0x0 ||
                   (iVar6 = strcmp((char *)key,(char *)pxVar8->key), iVar6 == 0)) &&
                  ((key2 == (xmlChar *)0x0 ||
                   ((pxVar8->key2 != (xmlChar *)0x0 &&
                    (iVar6 = strcmp((char *)key2,(char *)pxVar8->key2), iVar6 == 0)))))) &&
                 ((key3 == (xmlChar *)0x0 ||
                  ((pxVar8->key3 != (xmlChar *)0x0 &&
                   (iVar6 = strcmp((char *)key3,(char *)pxVar8->key3), iVar6 == 0))))))) {
            pxVar3 = pxVar8->key;
            pxVar4 = pxVar8->key2;
            pxVar5 = pxVar8->key3;
            (*scan)(pxVar8->payload,data,pxVar3,pxVar4,pxVar5);
            if ((pxVar8->hashValue == 0) ||
               ((pxVar8->payload == (void *)0x0 ||
                (((pxVar8->key == pxVar3 && (pxVar8->key2 == pxVar4)) && (pxVar8->key3 == pxVar5))))
               )) break;
          }
        }
        pxVar8 = pxVar8 + 1;
        if (pxVar2 + uVar1 <= pxVar8) {
          pxVar8 = hash->table;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < hash->size);
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull3(xmlHashTablePtr hash, const xmlChar *key,
                 const xmlChar *key2, const xmlChar *key3,
                 xmlHashScannerFull scan, void *data) {
    const xmlHashEntry *entry, *end;
    xmlHashEntry old;
    unsigned i;

    if ((hash == NULL) || (hash->size == 0) || (scan == NULL))
        return;

    /*
     * We must handle the case that a scanned entry is removed when executing
     * the callback (xmlCleanSpecialAttr and possibly other places).
     *
     * Find the start of a probe sequence to avoid scanning entries twice if
     * a deletion happens.
     */
    entry = hash->table;
    end = &hash->table[hash->size];
    while (entry->hashValue != 0) {
        if (++entry >= end)
            entry = hash->table;
    }

    for (i = 0; i < hash->size; i++) {
        if ((entry->hashValue != 0) && (entry->payload != NULL)) {
            /*
             * Make sure to rescan after a possible deletion.
             */
            do {
                if (((key != NULL) && (strcmp((const char *) key,
                                              (const char *) entry->key) != 0)) ||
                    ((key2 != NULL) && (!xmlFastStrEqual(key2, entry->key2))) ||
                    ((key3 != NULL) && (!xmlFastStrEqual(key3, entry->key3))))
                    break;
                old = *entry;
                scan(entry->payload, data, entry->key, entry->key2, entry->key3);
            } while ((entry->hashValue != 0) &&
                     (entry->payload != NULL) &&
                     ((entry->key != old.key) ||
                      (entry->key2 != old.key2) ||
                      (entry->key3 != old.key3)));
        }
        if (++entry >= end)
            entry = hash->table;
    }
}